

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<6UL>::GetDescriptor
          (SimpleTypeHandler<6UL> *this,PropertyId propertyId,PropertyIndex *index)

{
  PropertyId PVar1;
  PropertyRecord *this_00;
  ushort local_2a;
  PropertyIndex i;
  PropertyIndex *index_local;
  PropertyId propertyId_local;
  SimpleTypeHandler<6UL> *this_local;
  
  local_2a = 0;
  while( true ) {
    if (this->propertyCount <= (int)(uint)local_2a) {
      return 0;
    }
    this_00 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                        (&this->descriptors[local_2a].Id);
    PVar1 = PropertyRecord::GetPropertyId(this_00);
    if (PVar1 == propertyId) break;
    local_2a = local_2a + 1;
  }
  *index = local_2a;
  return 1;
}

Assistant:

BOOL SimpleTypeHandler<size>::GetDescriptor(PropertyId propertyId, PropertyIndex * index)
    {
        for (PropertyIndex i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                *index = i;
                return true;
            }
        }
        return false;
    }